

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cxx
# Opt level: O0

void __thiscall Function::~Function(Function *this)

{
  Function *this_local;
  
  (this->super_Physical)._vptr_Physical = (_func_int **)&PTR__Function_0018f008;
  if (((this->xLeft != (Function *)0x0) &&
      (this->xLeft->functionUseCount = this->xLeft->functionUseCount + -1,
      this->xLeft->functionUseCount != 0)) && (this->xLeft != (Function *)0x0)) {
    (*(this->xLeft->super_Physical)._vptr_Physical[1])();
  }
  if (((this->xRight != (Function *)0x0) &&
      (this->xRight->functionUseCount = this->xRight->functionUseCount + -1,
      this->xRight->functionUseCount != 0)) && (this->xRight != (Function *)0x0)) {
    (*(this->xRight->super_Physical)._vptr_Physical[1])();
  }
  if (((this->xPlus != (Function *)0x0) &&
      (this->xPlus->functionUseCount = this->xPlus->functionUseCount + -1,
      this->xPlus->functionUseCount != 0)) && (this->xPlus != (Function *)0x0)) {
    (*(this->xPlus->super_Physical)._vptr_Physical[1])();
  }
  std::__cxx11::string::~string((string *)&this->sName);
  std::vector<Function_*,_std::allocator<Function_*>_>::~vector(&this->vParents);
  Physical::~Physical(&this->super_Physical);
  return;
}

Assistant:

Function::~Function()
{
	if (xLeft) {
		xLeft->functionUseCount--;
		if (xLeft->functionUseCount)
			delete xLeft;
	}
	if (xRight) {
		xRight->functionUseCount--;
		if (xRight->functionUseCount)
			delete xRight;
	}
	if (xPlus) {
		xPlus->functionUseCount--;
		if (xPlus->functionUseCount)
			delete xPlus;
	}
}